

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

int __thiscall ON_4fPoint::MaximumCoordinateIndex(ON_4fPoint *this)

{
  double dVar1;
  double dVar2;
  uint local_1c;
  int i;
  float *a;
  ON_4fPoint *this_local;
  
  dVar1 = std::fabs((double)(ulong)(uint)this->y);
  dVar2 = std::fabs((double)(ulong)(uint)this->x);
  local_1c = (uint)(SUB84(dVar2,0) < SUB84(dVar1,0));
  dVar1 = std::fabs((double)(ulong)(uint)this->z);
  dVar2 = std::fabs((double)(ulong)(uint)(&this->x)[(int)local_1c]);
  if (SUB84(dVar2,0) < SUB84(dVar1,0)) {
    local_1c = 2;
  }
  dVar1 = std::fabs((double)(ulong)(uint)this->w);
  dVar2 = std::fabs((double)(ulong)(uint)(&this->x)[(int)local_1c]);
  if (SUB84(dVar2,0) < SUB84(dVar1,0)) {
    local_1c = 3;
  }
  return local_1c;
}

Assistant:

int ON_4fPoint::MaximumCoordinateIndex() const
{
  const float* a = &x;
  int i = ( fabs(y) > fabs(x) ) ? 1 : 0;
  if (fabs(z) > fabs(a[i])) i = 2; if (fabs(w) > fabs(a[i])) i = 3;
  return i;
}